

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

ImVec2 ImTriangleClosestPoint(ImVec2 *a,ImVec2 *b,ImVec2 *c,ImVec2 *p)

{
  float fVar1;
  ImVec2 IVar2;
  float fVar3;
  ImVec2 IVar4;
  float fVar5;
  ImVec2 IVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  fVar5 = p->x;
  fVar7 = p->y;
  fVar9 = a->x;
  fVar8 = a->y;
  fVar10 = b->x;
  fVar12 = b->y;
  fVar3 = fVar10 - fVar9;
  fVar1 = fVar12 - fVar8;
  fVar11 = (fVar5 - fVar9) * fVar3 + (fVar7 - fVar8) * fVar1;
  if (0.0 <= fVar11) {
    fVar13 = fVar3 * fVar3 + fVar1 * fVar1;
    if (fVar11 <= fVar13) {
      IVar4.x = (fVar3 * fVar11) / fVar13 + fVar9;
      IVar4.y = (fVar1 * fVar11) / fVar13 + fVar8;
    }
    else {
      IVar4 = *b;
    }
  }
  else {
    IVar4 = *a;
  }
  fVar1 = c->x;
  fVar3 = c->y;
  fVar11 = fVar1 - fVar10;
  fVar13 = fVar3 - fVar12;
  fVar14 = (fVar5 - fVar10) * fVar11 + (fVar7 - fVar12) * fVar13;
  if (0.0 <= fVar14) {
    fVar15 = fVar11 * fVar11 + fVar13 * fVar13;
    if (fVar14 <= fVar15) {
      IVar6.x = fVar10 + (fVar11 * fVar14) / fVar15;
      IVar6.y = fVar12 + (fVar13 * fVar14) / fVar15;
    }
    else {
      IVar6 = *c;
    }
  }
  else {
    IVar6 = *b;
  }
  fVar9 = fVar9 - fVar1;
  fVar8 = fVar8 - fVar3;
  fVar10 = (fVar5 - fVar1) * fVar9 + (fVar7 - fVar3) * fVar8;
  if (0.0 <= fVar10) {
    fVar12 = fVar9 * fVar9 + fVar8 * fVar8;
    if (fVar10 <= fVar12) {
      IVar2.x = fVar1 + (fVar9 * fVar10) / fVar12;
      IVar2.y = fVar3 + (fVar8 * fVar10) / fVar12;
    }
    else {
      IVar2 = *a;
    }
  }
  else {
    IVar2 = *c;
  }
  fVar9 = fVar5 - IVar4.x;
  fVar8 = fVar7 - IVar4.y;
  fVar9 = fVar9 * fVar9 + fVar8 * fVar8;
  fVar8 = fVar5 - IVar6.x;
  fVar10 = fVar7 - IVar6.y;
  fVar8 = fVar8 * fVar8 + fVar10 * fVar10;
  fVar5 = fVar5 - IVar2.x;
  fVar7 = fVar7 - IVar2.y;
  fVar7 = fVar5 * fVar5 + fVar7 * fVar7;
  fVar5 = fVar8;
  if (fVar7 <= fVar8) {
    fVar5 = fVar7;
  }
  fVar7 = fVar9;
  if (fVar5 <= fVar9) {
    fVar7 = fVar5;
  }
  if ((fVar7 == fVar8) && (!NAN(fVar7) && !NAN(fVar8))) {
    IVar2 = IVar6;
  }
  if ((fVar7 == fVar9) && (!NAN(fVar7) && !NAN(fVar9))) {
    IVar2 = IVar4;
  }
  return IVar2;
}

Assistant:

static inline ImVec2 operator-(const ImVec2& lhs, const ImVec2& rhs)            { return ImVec2(lhs.x-rhs.x, lhs.y-rhs.y); }